

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP.cpp
# Opt level: O0

bool __thiscall SRUP_MSG::Verify(SRUP_MSG *this,char *key)

{
  uint uVar1;
  undefined1 local_48 [8];
  SRUP_Crypto Crypto;
  char *key_local;
  SRUP_MSG *this_local;
  
  Crypto._32_8_ = key;
  uVar1 = (*this->_vptr_SRUP_MSG[9])();
  if ((uVar1 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else if (Crypto._32_8_ == 0) {
    this_local._7_1_ = false;
  }
  else {
    SRUP_Crypto::SRUP_Crypto((SRUP_Crypto *)local_48);
    SRUP_Crypto::signature((SRUP_Crypto *)local_48,this->m_signature,this->m_sig_len);
    (*this->_vptr_SRUP_MSG[10])(this,1);
    this_local._7_1_ =
         SRUP_Crypto::Verify((SRUP_Crypto *)local_48,this->m_unsigned_message,
                             (ulong)this->m_unsigned_length,(char *)Crypto._32_8_);
    SRUP_Crypto::~SRUP_Crypto((SRUP_Crypto *)local_48);
  }
  return this_local._7_1_;
}

Assistant:

bool SRUP_MSG::Verify(char *key)
{
    if (!DataCheck())
        return false;

    if (key == nullptr)
        return false;

    SRUP_Crypto Crypto;
    Crypto.signature(m_signature, m_sig_len);
    Serialize(true);
    return Crypto.Verify(m_unsigned_message, m_unsigned_length, key);
}